

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&>,std::tuple<int&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<const_phmap::priv::NonStandardLayout_&> *args_1,tuple<int_&> *args_2)

{
  __gnu_cxx::new_allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>::
  construct<std::pair<phmap::priv::NonStandardLayout_const,int>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&>,std::tuple<int&>>
            ((new_allocator<std::pair<phmap::priv::NonStandardLayout_const,int>> *)(this + 0x28),
             (pair<const_phmap::priv::NonStandardLayout,_int> *)(i * 0x30 + *(long *)(this + 8)),
             args,args_1,args_2);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }